

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

void __thiscall iDynTree::InverseKinematics::setMaxIterations(InverseKinematics *this,int max_iter)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return;
}

Assistant:

void InverseKinematics::setMaxIterations(const int max_iter)
    {
#ifdef IDYNTREE_USES_IPOPT
        if (max_iter>0)
            IK_PIMPL(m_pimpl)->m_maxIter = max_iter;
        else
            IK_PIMPL(m_pimpl)->m_maxIter = std::numeric_limits<int>::max();
#else
        missingIpoptErrorReport();
#endif
    }